

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::get_binary_offset_for_decoration
          (Compiler *this,VariableID id,Decoration decoration,uint32_t *word_offset)

{
  Meta *pMVar1;
  const_iterator cVar2;
  key_type_conflict local_14;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)id.id);
  if ((pMVar1 != (Meta *)0x0) &&
     (cVar2 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(pMVar1->decoration_word_offset)._M_h,&local_14),
     cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
     (__node_type *)0x0)) {
    *word_offset = *(uint32_t *)
                    ((long)cVar2.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur + 0xc);
    return true;
  }
  return false;
}

Assistant:

bool Compiler::get_binary_offset_for_decoration(VariableID id, spv::Decoration decoration, uint32_t &word_offset) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &word_offsets = m->decoration_word_offset;
	auto itr = word_offsets.find(decoration);
	if (itr == end(word_offsets))
		return false;

	word_offset = itr->second;
	return true;
}